

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

void test_shutdown(void)

{
  uint uVar1;
  cio_http_server_close_hook_t close_hook;
  cio_error cVar2;
  cio_inet_address *arg1;
  long lVar3;
  cio_http_server_configuration config;
  cio_http_server server;
  
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 0x10) {
    close_hook = *(cio_http_server_close_hook_t *)((long)&DAT_00118bf0 + lVar3);
    uVar1 = *(uint *)((long)&DAT_00118bf8 + lVar3);
    memcpy(&config,&DAT_001199e0,0xb8);
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address(&config.endpoint,arg1,0x1f90);
    cVar2 = cio_http_server_init(&server,&loop,&config);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Server initialization failed!",0x40e,UNITY_DISPLAY_STYLE_INT);
    cVar2 = cio_http_server_shutdown(&server,close_hook);
    UnityAssertEqualNumber
              ((ulong)uVar1,(ulong)http_close_hook_fake.call_count,
               "http close hook was not called correctly",0x410,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber(0,(long)cVar2,"Server shutdown failed!",0x411,UNITY_DISPLAY_STYLE_INT);
    free(&client_socket[-2].impl.close_timer.impl.ev.fd);
    setUp();
  }
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  return;
}

Assistant:

static void test_shutdown(void)
{
	struct shutdown_args {
		void (*close_hook)(const struct cio_http_server *server);
		unsigned int close_hook_call_count;
		enum cio_error expected_result;
	};

	struct shutdown_args shutdown_args[] = {
	    {.close_hook = NULL, .close_hook_call_count = 0, .expected_result = CIO_SUCCESS},
	    {.close_hook = http_close_hook, .close_hook_call_count = 1, .expected_result = CIO_SUCCESS},
	};

	struct cio_http_server server;

	for (unsigned int i = 0; i < ARRAY_SIZE(shutdown_args); i++) {
		struct shutdown_args args = shutdown_args[i];

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = 10,
		    .alloc_client = alloc_dummy_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");
		err = cio_http_server_shutdown(&server, args.close_hook);
		TEST_ASSERT_EQUAL_MESSAGE(args.close_hook_call_count, http_close_hook_fake.call_count, "http close hook was not called correctly");
		TEST_ASSERT_EQUAL_MESSAGE(args.expected_result, err, "Server shutdown failed!");

		free_dummy_client(client_socket);
		setUp();
	}

	free_dummy_client(client_socket);
}